

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O1

int h264_mb_pred(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint32_t uVar5;
  int32_t iVar6;
  uint32_t *puVar7;
  uint32_t (*pauVar8) [4];
  int32_t (*paiVar9) [2];
  int32_t *piVar10;
  long lVar11;
  long lVar12;
  uint32_t uVar13;
  int ifrom [4];
  int pmode [4];
  int32_t *local_60;
  int local_58 [4];
  int local_48;
  int local_44;
  int local_40;
  
  uVar1 = mb->mb_type;
  uVar4 = (ulong)uVar1;
  if (uVar4 < 0x1b) {
    if (uVar1 - 0x19 < 0xffffffe8) {
      if (mb->transform_size_8x8_flag == 0) {
        puVar7 = mb->prev_intra4x4_pred_mode_flag;
        lVar11 = 0x10;
        do {
          iVar2 = h264_prev_intra_pred_mode_flag(str,cabac,puVar7);
          if (iVar2 != 0) {
            return 1;
          }
          if ((*puVar7 == 0) &&
             (iVar2 = h264_rem_intra_pred_mode(str,cabac,puVar7 + 0x10), iVar2 != 0)) {
            return 1;
          }
          puVar7 = puVar7 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      else {
        puVar7 = mb->prev_intra8x8_pred_mode_flag;
        lVar11 = 4;
        do {
          iVar2 = h264_prev_intra_pred_mode_flag(str,cabac,puVar7);
          if (iVar2 != 0) {
            return 1;
          }
          if ((*puVar7 == 0) && (iVar2 = h264_rem_intra_pred_mode(str,cabac,puVar7 + 4), iVar2 != 0)
             ) {
            return 1;
          }
          puVar7 = puVar7 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
    }
    if (slice->chroma_array_type - 1 < 2) {
      iVar2 = h264_intra_chroma_pred_mode(str,cabac,&mb->intra_chroma_pred_mode);
    }
    else {
      iVar2 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
    }
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = infer_intra(str,mb,0);
  }
  else {
    if (uVar1 != 0x21) {
      local_58[0] = -1;
      iVar2 = mb_part_info[uVar4][0];
      local_48 = mb_part_info[uVar4][1];
      if (iVar2 == 2) {
        local_58[1] = -1;
        local_58[2] = 0;
        local_58[3] = 1;
        local_44 = mb_part_info[uVar4][2];
      }
      else if (iVar2 == 1) {
        local_58[1] = 0;
        local_58[2] = -1;
        local_58[3] = 2;
        local_40 = mb_part_info[uVar4][2];
      }
      else if (iVar2 == 0) {
        local_58[1] = 0;
        local_58[2] = 0;
        local_58[3] = 0;
      }
      uVar13 = slice->num_ref_idx_l0_active_minus1;
      if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
        uVar13 = uVar13 * 2 + 1;
      }
      lVar11 = 0;
      pauVar8 = mb->ref_idx;
      do {
        if ((long)local_58[lVar11] == -1) {
          if ((*(byte *)(&local_48 + lVar11) & 1) == 0) {
            uVar5 = 0;
            goto LAB_001084d3;
          }
          iVar2 = h264_ref_idx(str,cabac,(int)lVar11,0,uVar13,*pauVar8);
        }
        else {
          uVar5 = mb->ref_idx[0][local_58[lVar11]];
LAB_001084d3:
          iVar2 = vs_infer(str,*pauVar8,uVar5);
        }
        if (iVar2 != 0) {
          return 1;
        }
        lVar11 = lVar11 + 1;
        pauVar8 = (uint32_t (*) [4])(*pauVar8 + 1);
      } while (lVar11 != 4);
      uVar13 = slice->num_ref_idx_l1_active_minus1;
      if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
        uVar13 = uVar13 * 2 + 1;
      }
      lVar11 = 0;
      pauVar8 = mb->ref_idx + 1;
      do {
        if ((long)local_58[lVar11] == -1) {
          if ((*(byte *)(&local_48 + lVar11) & 2) == 0) {
            uVar5 = 0;
            goto LAB_00108562;
          }
          iVar2 = h264_ref_idx(str,cabac,(int)lVar11,1,uVar13,*pauVar8);
        }
        else {
          uVar5 = mb->ref_idx[1][local_58[lVar11]];
LAB_00108562:
          iVar2 = vs_infer(str,*pauVar8,uVar5);
        }
        if (iVar2 != 0) {
          return 1;
        }
        lVar11 = lVar11 + 1;
        pauVar8 = (uint32_t (*) [4])(*pauVar8 + 1);
      } while (lVar11 != 4);
      local_60 = mb->mvd[0][1] + 1;
      lVar11 = 0;
      do {
        lVar12 = (long)local_58[lVar11];
        if (lVar12 == -1) {
          iVar2 = (int)lVar11 * 4;
          if ((*(byte *)(&local_48 + lVar11) & 1) == 0) {
            paiVar9 = mb->mvd[0] + lVar11 * 4;
            iVar2 = vs_infers(str,*paiVar9,0);
            if (iVar2 != 0) {
              return 1;
            }
            iVar6 = 0;
            goto LAB_00108647;
          }
          paiVar9 = mb->mvd[0] + lVar11 * 4;
          iVar3 = h264_mvd(str,cabac,iVar2,0,0,*paiVar9);
          if (iVar3 != 0) {
            return 1;
          }
          iVar2 = h264_mvd(str,cabac,iVar2,1,0,*paiVar9 + 1);
        }
        else {
          paiVar9 = mb->mvd[0] + lVar11 * 4;
          iVar2 = vs_infers(str,*paiVar9,mb->mvd[0][lVar12 * 4][0]);
          if (iVar2 != 0) {
            return 1;
          }
          iVar6 = mb->mvd[0][lVar12 * 4][1];
LAB_00108647:
          iVar2 = vs_infers(str,*paiVar9 + 1,iVar6);
        }
        if (iVar2 != 0) {
          return 1;
        }
        lVar12 = 3;
        piVar10 = local_60;
        do {
          iVar2 = vs_infers(str,(int32_t *)(piVar10 + -1),mb->mvd[0][lVar11 * 4][0]);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infers(str,piVar10,mb->mvd[0][lVar11 * 4][1]);
          if (iVar2 != 0) {
            return 1;
          }
          piVar10 = piVar10 + 2;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        lVar11 = lVar11 + 1;
        local_60 = local_60 + 8;
      } while (lVar11 != 4);
      local_60 = mb->mvd[1][1] + 1;
      lVar11 = 0;
      do {
        lVar12 = (long)local_58[lVar11];
        if (lVar12 == -1) {
          iVar2 = (int)lVar11 * 4;
          if ((*(byte *)(&local_48 + lVar11) & 2) == 0) {
            paiVar9 = mb->mvd[1] + lVar11 * 4;
            iVar2 = vs_infers(str,*paiVar9,0);
            if (iVar2 != 0) {
              return 1;
            }
            iVar6 = 0;
            goto LAB_001087ba;
          }
          paiVar9 = mb->mvd[1] + lVar11 * 4;
          iVar3 = h264_mvd(str,cabac,iVar2,0,1,*paiVar9);
          if (iVar3 != 0) {
            return 1;
          }
          iVar2 = h264_mvd(str,cabac,iVar2,1,1,*paiVar9 + 1);
        }
        else {
          paiVar9 = mb->mvd[1] + lVar11 * 4;
          iVar2 = vs_infers(str,*paiVar9,mb->mvd[1][lVar12 * 4][0]);
          if (iVar2 != 0) {
            return 1;
          }
          iVar6 = (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[lVar12 * 4][1];
LAB_001087ba:
          iVar2 = vs_infers(str,*paiVar9 + 1,iVar6);
        }
        if (iVar2 != 0) {
          return 1;
        }
        lVar12 = 3;
        piVar10 = local_60;
        do {
          iVar2 = vs_infers(str,(int32_t *)(piVar10 + -1),mb->mvd[1][lVar11 * 4][0]);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infers(str,piVar10,
                            (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[lVar11 * 4][1]);
          if (iVar2 != 0) {
            return 1;
          }
          piVar10 = piVar10 + 2;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        lVar11 = lVar11 + 1;
        local_60 = local_60 + 8;
      } while (lVar11 != 4);
      iVar2 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
      goto LAB_0010842e;
    }
    iVar2 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = infer_intra(str,mb,0);
  }
  if (iVar2 != 0) {
    return 1;
  }
  iVar2 = infer_intra(str,mb,1);
LAB_0010842e:
  return (uint)(iVar2 != 0);
}

Assistant:

int h264_mb_pred(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	int i, j;
	if (mb->mb_type < H264_MB_TYPE_P_BASE) {
		if (!h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (!mb->transform_size_8x8_flag) {
				for (i = 0; i < 16; i++) {
					if (h264_prev_intra_pred_mode_flag(str, cabac, &mb->prev_intra4x4_pred_mode_flag[i])) return 1;
					if (!mb->prev_intra4x4_pred_mode_flag[i])
						if (h264_rem_intra_pred_mode(str, cabac, &mb->rem_intra4x4_pred_mode[i])) return 1;
				}
			} else {
				for (i = 0; i < 4; i++) {
					if (h264_prev_intra_pred_mode_flag(str, cabac, &mb->prev_intra8x8_pred_mode_flag[i])) return 1;
					if (!mb->prev_intra8x8_pred_mode_flag[i])
						if (h264_rem_intra_pred_mode(str, cabac, &mb->rem_intra8x8_pred_mode[i])) return 1;
				}
			}
		}
		if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
			if (h264_intra_chroma_pred_mode(str, cabac, &mb->intra_chroma_pred_mode)) return 1;
		} else {
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		}
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
	} else if (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16) {
		int ifrom[4], pmode[4];
		ifrom[0] = -1;
		pmode[0] = mb_part_info[mb->mb_type][1];
		switch (mb_part_info[mb->mb_type][0]) {
			case 0: /* 16x16 */
				ifrom[1] = 0;
				ifrom[2] = 0;
				ifrom[3] = 0;
				break;
			case 1: /* 16x8 */
				ifrom[1] = 0;
				ifrom[2] = -1;
				ifrom[3] = 2;
				pmode[2] = mb_part_info[mb->mb_type][2];
				break;
			case 2:
				ifrom[1] = -1;
				ifrom[2] = 0;
				ifrom[3] = 1;
				pmode[1] = mb_part_info[mb->mb_type][2];
				break;
		}
		int max = slice->num_ref_idx_l0_active_minus1;
		if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
			max *= 2, max++;
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 1) {
					if (h264_ref_idx(str, cabac, i, 0, max, &mb->ref_idx[0][i])) return 1;
				} else {
					if (vs_infer(str, &mb->ref_idx[0][i], 0)) return 1;
				}
			} else {
				if (vs_infer(str, &mb->ref_idx[0][i], mb->ref_idx[0][ifrom[i]])) return 1;
			}
		}
		max = slice->num_ref_idx_l1_active_minus1;
		if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
			max *= 2, max++;
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 2) {
					if (h264_ref_idx(str, cabac, i, 1, max, &mb->ref_idx[1][i])) return 1;
				} else {
					if (vs_infer(str, &mb->ref_idx[1][i], 0)) return 1;
				}
			} else {
				if (vs_infer(str, &mb->ref_idx[1][i], mb->ref_idx[1][ifrom[i]])) return 1;
			}
		}
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 1) {
					if (h264_mvd(str, cabac, i * 4, 0, 0, &mb->mvd[0][i*4][0])) return 1;
					if (h264_mvd(str, cabac, i * 4, 1, 0, &mb->mvd[0][i*4][1])) return 1;
				} else {
					if (vs_infers(str, &mb->mvd[0][i*4][0], 0)) return 1;
					if (vs_infers(str, &mb->mvd[0][i*4][1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &mb->mvd[0][i*4][0], mb->mvd[0][ifrom[i]*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[0][i*4][1], mb->mvd[0][ifrom[i]*4][1])) return 1;
			}
			for (j = 1; j < 4; j++) {
				if (vs_infers(str, &mb->mvd[0][i*4+j][0], mb->mvd[0][i*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[0][i*4+j][1], mb->mvd[0][i*4][1])) return 1;
			}
		}
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 2) {
					if (h264_mvd(str, cabac, i * 4, 0, 1, &mb->mvd[1][i*4][0])) return 1;
					if (h264_mvd(str, cabac, i * 4, 1, 1, &mb->mvd[1][i*4][1])) return 1;
				} else {
					if (vs_infers(str, &mb->mvd[1][i*4][0], 0)) return 1;
					if (vs_infers(str, &mb->mvd[1][i*4][1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &mb->mvd[1][i*4][0], mb->mvd[1][ifrom[i]*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[1][i*4][1], mb->mvd[1][ifrom[i]*4][1])) return 1;
			}
			for (j = 1; j < 4; j++) {
				if (vs_infers(str, &mb->mvd[1][i*4+j][0], mb->mvd[1][i*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[1][i*4+j][1], mb->mvd[1][i*4][1])) return 1;
			}
		}
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	} else {
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
	}
	return 0;
}